

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_req_handlers.cxx
# Opt level: O0

ptr<resp_msg> __thiscall cornerstone::raft_server::handle_cli_req(raft_server *this,req_msg *req)

{
  raft_server *prVar1;
  bool bVar2;
  int iVar3;
  element_type *peVar4;
  vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
  *this_00;
  socklen_t *__addr_len;
  element_type *peVar5;
  ulong term;
  element_type *peVar6;
  reference pvVar7;
  element_type *peVar8;
  undefined4 extraout_var;
  buffer *pbVar9;
  element_type *this_01;
  req_msg *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  sockaddr *__addr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  long in_RSI;
  element_type *in_RDI;
  ptr<cornerstone::resp_msg> pVar11;
  ptr<resp_msg> pVar12;
  size_t i;
  vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
  *entries;
  bool leader;
  ptr<resp_msg> *resp;
  size_type in_stack_fffffffffffffef8;
  vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
  *in_stack_ffffffffffffff00;
  int *in_stack_ffffffffffffff08;
  log_entry *in_stack_ffffffffffffff10;
  unsigned_long *in_stack_ffffffffffffff18;
  raft_server *in_stack_ffffffffffffff40;
  socklen_t *local_68;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  
  bVar2 = is_leader((raft_server *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if ((*(int *)(in_RSI + 0x128) != 3) || (bVar2)) {
    peVar4 = std::
             __shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1d61aa);
    srv_state::get_term(peVar4);
    pVar11 = cs_new<cornerstone::resp_msg,unsigned_long,cornerstone::msg_type,int&,int&>
                       (in_stack_ffffffffffffff18,(msg_type *)in_stack_ffffffffffffff10,
                        in_stack_ffffffffffffff08,(int *)in_stack_ffffffffffffff00);
    _Var10 = pVar11.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (bVar2) {
      this_00 = req_msg::log_entries(in_RDX);
      for (local_68 = (socklen_t *)0x0;
          __addr_len = (socklen_t *)
                       std::
                       vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                       ::size(this_00), local_68 < __addr_len;
          local_68 = (socklen_t *)((long)local_68 + 1)) {
        std::
        vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
        ::at(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        peVar5 = std::
                 __shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1d629b);
        peVar4 = std::
                 __shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1d62b4);
        term = srv_state::get_term(peVar4);
        log_entry::set_term(peVar5,term);
        peVar6 = std::
                 __shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1d62e8);
        pvVar7 = std::
                 vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                 ::at(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        (*peVar6->_vptr_log_store[5])(peVar6,pvVar7);
        peVar8 = std::
                 __shared_ptr_access<cornerstone::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cornerstone::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1d6332);
        peVar6 = std::
                 __shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1d634b);
        iVar3 = (*peVar6->_vptr_log_store[2])();
        in_stack_ffffffffffffff40 = (raft_server *)CONCAT44(extraout_var,iVar3);
        prVar1 = in_stack_ffffffffffffff40 + -1;
        std::
        vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
        ::at(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        std::__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1d6391);
        pbVar9 = log_entry::get_buf(in_stack_ffffffffffffff10);
        std::
        vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
        ::at(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        peVar5 = std::
                 __shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1d63c6);
        in_stack_ffffffffffffff10 = (log_entry *)log_entry::get_cookie(peVar5);
        (*peVar8->_vptr_state_machine[3])
                  (peVar8,(undefined1 *)
                          ((long)&(prVar1->prevote_state_)._M_t.
                                  super___uniq_ptr_impl<cornerstone::prevote_state,_std::default_delete<cornerstone::prevote_state>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cornerstone::prevote_state_*,_std::default_delete<cornerstone::prevote_state>_>
                                  .super__Head_base<0UL,_cornerstone::prevote_state_*,_false>.
                                  _M_head_impl + 7),pbVar9,in_stack_ffffffffffffff10);
      }
      request_append_entries(in_stack_ffffffffffffff40);
      this_01 = std::
                __shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1d6451);
      peVar6 = std::
               __shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1d646a);
      iVar3 = (*peVar6->_vptr_log_store[2])();
      resp_msg::accept(this_01,iVar3,__addr,__addr_len);
      _Var10._M_pi = extraout_RDX;
    }
  }
  else {
    peVar4 = std::
             __shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1d6132);
    srv_state::get_term(peVar4);
    pVar11 = cs_new<cornerstone::resp_msg,unsigned_long,cornerstone::msg_type,int&,int>
                       (in_stack_ffffffffffffff18,(msg_type *)in_stack_ffffffffffffff10,
                        in_stack_ffffffffffffff08,(int *)in_stack_ffffffffffffff00);
    _Var10 = pVar11.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
  }
  pVar12.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var10._M_pi;
  pVar12.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<resp_msg>)pVar12.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr<resp_msg> raft_server::handle_cli_req(req_msg& req)
{
    bool leader = is_leader();

    // check if leader has expired.
    // there could be a case that the leader just elected, in that case, client can
    // just simply retry, no safety issue here.
    if (role_ == srv_role::leader && !leader)
    {
        return cs_new<resp_msg>(state_->get_term(), msg_type::append_entries_response, id_, -1);
    }

    ptr<resp_msg> resp(cs_new<resp_msg>(state_->get_term(), msg_type::append_entries_response, id_, leader_));
    if (!leader)
    {
        return resp;
    }

    std::vector<ptr<log_entry>>& entries = req.log_entries();
    for (size_t i = 0; i < entries.size(); ++i)
    {
        // force the log's term to current term
        entries.at(i)->set_term(state_->get_term());

        log_store_->append(entries.at(i));
        state_machine_->pre_commit(log_store_->next_slot() - 1, entries.at(i)->get_buf(), entries.at(i)->get_cookie());
    }

    // urgent commit, so that the commit will not depend on hb
    request_append_entries();
    resp->accept(log_store_->next_slot());
    return resp;
}